

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

int lyb_parse_model(char *data,lys_module **mod,lyb_state *lybs)

{
  int iVar1;
  int iVar2;
  lys_module *plVar3;
  char *pcVar4;
  char *local_88;
  char *local_68;
  ushort local_46;
  char local_43 [5];
  uint16_t rev;
  char mod_rev [11];
  char *mod_name;
  int ret;
  int r;
  lyb_state *lybs_local;
  lys_module **mod_local;
  char *data_local;
  
  mod_rev[3] = '\0';
  mod_rev[4] = '\0';
  mod_rev[5] = '\0';
  mod_rev[6] = '\0';
  mod_rev[7] = '\0';
  mod_rev[8] = '\0';
  mod_rev[9] = '\0';
  mod_rev[10] = '\0';
  iVar1 = lyb_read_string(data,(char **)(mod_rev + 3),1,lybs);
  if (-1 < iVar1) {
    iVar2 = lyb_read_number(&local_46,2,2,data + iVar1,lybs);
    if (-1 < iVar2) {
      if (local_46 == 0) {
        plVar3 = ly_ctx_get_module(lybs->ctx,(char *)mod_rev._3_8_,(char *)0x0,0);
        *mod = plVar3;
      }
      else {
        sprintf(local_43,"%04u-%02u-%02u",(ulong)(((int)(local_46 & 0xfe00) >> 9) + 2000),
                (ulong)(uint)((int)(local_46 & 0x1e0) >> 5),(ulong)(local_46 & 0x1f));
        plVar3 = ly_ctx_get_module(lybs->ctx,(char *)mod_rev._3_8_,local_43,0);
        *mod = plVar3;
      }
      if (lybs->ctx->data_clb != (ly_module_data_clb)0x0) {
        if (*mod == (lys_module *)0x0) {
          plVar3 = (*lybs->ctx->data_clb)
                             (lybs->ctx,(char *)mod_rev._3_8_,(char *)0x0,0,lybs->ctx->data_clb_data
                             );
          *mod = plVar3;
        }
        else if ((*(ushort *)&(*mod)->field_0x40 >> 7 & 1) == 0) {
          plVar3 = (*lybs->ctx->data_clb)
                             (lybs->ctx,(char *)mod_rev._3_8_,(*mod)->ns,1,lybs->ctx->data_clb_data)
          ;
          *mod = plVar3;
        }
      }
      if (*mod == (lys_module *)0x0) {
        pcVar4 = "";
        if (local_46 == 0) {
          local_68 = "";
        }
        else {
          pcVar4 = "@";
          local_68 = local_43;
        }
        ly_log(lybs->ctx,LY_LLERR,LY_EINVAL,
               "Invalid context for LYB data parsing, missing module \"%s%s%s\".",mod_rev._3_8_,
               pcVar4,local_68);
      }
      else {
        if ((*(ushort *)&(*mod)->field_0x40 >> 7 & 1) != 0) {
          free((void *)mod_rev._3_8_);
          return iVar2 + iVar1;
        }
        pcVar4 = "";
        if (local_46 == 0) {
          local_88 = "";
        }
        else {
          pcVar4 = "@";
          local_88 = local_43;
        }
        ly_log(lybs->ctx,LY_LLERR,LY_EINVAL,
               "Invalid context for LYB data parsing, module \"%s%s%s\" not implemented.",
               mod_rev._3_8_,pcVar4,local_88);
      }
    }
  }
  free((void *)mod_rev._3_8_);
  return -1;
}

Assistant:

static int
lyb_parse_model(const char *data, const struct lys_module **mod, struct lyb_state *lybs)
{
    int r, ret = 0;
    char *mod_name = NULL, mod_rev[11];
    uint16_t rev;

    /* model name */
    ret += (r = lyb_read_string(data, &mod_name, 1, lybs));
    LYB_HAVE_READ_GOTO(r, data, error);

    /* revision */
    ret += (r = lyb_read_number(&rev, sizeof rev, 2, data, lybs));
    LYB_HAVE_READ_GOTO(r, data, error);

    if (rev) {
        sprintf(mod_rev, "%04u-%02u-%02u", ((rev & 0xFE00) >> 9) + 2000, (rev & 0x01E0) >> 5, (rev & 0x001F));
        *mod = ly_ctx_get_module(lybs->ctx, mod_name, mod_rev, 0);
    } else {
        *mod = ly_ctx_get_module(lybs->ctx, mod_name, NULL, 0);
    }
    if (lybs->ctx->data_clb) {
        if (!*mod) {
            *mod = lybs->ctx->data_clb(lybs->ctx, mod_name, NULL, 0, lybs->ctx->data_clb_data);
        } else if (!(*mod)->implemented) {
            *mod = lybs->ctx->data_clb(lybs->ctx, mod_name, (*mod)->ns, LY_MODCLB_NOT_IMPLEMENTED, lybs->ctx->data_clb_data);
        }
    }

    if (!*mod) {
        LOGERR(lybs->ctx, LY_EINVAL, "Invalid context for LYB data parsing, missing module \"%s%s%s\".",
               mod_name, rev ? "@" : "", rev ? mod_rev : "");
        goto error;
    } else if (!(*mod)->implemented) {
        LOGERR(lybs->ctx, LY_EINVAL, "Invalid context for LYB data parsing, module \"%s%s%s\" not implemented.",
               mod_name, rev ? "@" : "", rev ? mod_rev : "");
        goto error;
    }

    free(mod_name);
    return ret;

error:
    free(mod_name);
    return -1;
}